

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unredacted_debug_format_for_test.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::UnredactedUtf8DebugFormatForTest_abi_cxx11_
          (string *__return_storage_ptr__,util *this,Message *message)

{
  Printer printer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  TextFormat::Printer::Printer(&printer);
  TextFormat::Printer::SetUseUtf8StringEscaping(&printer,true);
  printer.expand_any_ = true;
  if ((int)printer.report_sensitive_fields_ < 0x11) {
    printer.report_sensitive_fields_ = kUnredactedUtf8DebugFormatForTest;
  }
  TextFormat::Printer::PrintToString(&printer,(Message *)this,__return_storage_ptr__);
  TextFormat::Printer::~Printer(&printer);
  return __return_storage_ptr__;
}

Assistant:

std::string UnredactedUtf8DebugFormatForTest(const google::protobuf::Message& message) {
  std::string debug_string;

  google::protobuf::TextFormat::Printer printer;
  printer.SetUseUtf8StringEscaping(true);
  printer.SetExpandAny(true);
  printer.SetReportSensitiveFields(
      internal::FieldReporterLevel::kUnredactedUtf8DebugFormatForTest);

  printer.PrintToString(message, &debug_string);

  return debug_string;
}